

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred_ssse3_intr.c
# Opt level: O3

void ihevc_weighted_pred_bi_ssse3
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 wgt0,WORD32 off0,WORD32 wgt1,WORD32 off1,WORD32 shift,
               WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  unkbyte10 Var26;
  unkbyte10 Var27;
  unkbyte10 Var28;
  int iVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  short sVar33;
  undefined4 uVar34;
  short sVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar43;
  int iVar45;
  int iVar46;
  undefined1 auVar44 [16];
  int iVar47;
  short sVar48;
  int iVar49;
  short sVar51;
  undefined1 auVar50 [16];
  short sVar53;
  undefined1 auVar52 [16];
  int iVar54;
  undefined1 auVar57 [16];
  int iVar58;
  undefined1 auVar61 [16];
  int iVar62;
  short sVar64;
  int iVar65;
  short sVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  int iVar75;
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar63 [12];
  undefined1 auVar66 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [16];
  undefined1 auVar76 [12];
  undefined1 auVar77 [16];
  
  if ((wd & 3U) != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x2f7,
                  "void ihevc_weighted_pred_bi_ssse3(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if ((ht & 3U) != 0) {
    __assert_fail("(ht % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x2f8,
                  "void ihevc_weighted_pred_bi_ssse3(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  iVar29 = off0 + off1 + 1 << ((char)shift - 1U & 0x1f);
  auVar35 = pshuflw(ZEXT416((uint)lvl_shift1),ZEXT416((uint)lvl_shift1),0);
  uVar34 = auVar35._0_4_;
  auVar44._4_4_ = uVar34;
  auVar44._0_4_ = uVar34;
  auVar44._8_4_ = uVar34;
  auVar44._12_4_ = uVar34;
  auVar36 = pshuflw(ZEXT416((uint)wgt0),ZEXT416((uint)wgt0),0);
  auVar37._0_4_ = auVar36._0_4_;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar39 = pshuflw(ZEXT416((uint)lvl_shift2),ZEXT416((uint)lvl_shift2),0);
  uVar34 = auVar39._0_4_;
  auVar68._4_4_ = uVar34;
  auVar68._0_4_ = uVar34;
  auVar68._8_4_ = uVar34;
  auVar68._12_4_ = uVar34;
  auVar40 = pshuflw(ZEXT416((uint)wgt1),ZEXT416((uint)wgt1),0);
  auVar41._0_4_ = auVar40._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  sVar33 = auVar36._0_2_;
  sVar38 = auVar36._2_2_;
  sVar48 = auVar35._2_2_ * sVar38;
  auVar36 = pmulhw(auVar44,auVar37);
  iVar30 = CONCAT22(auVar36._6_2_,sVar48);
  Var25 = CONCAT64(CONCAT42(iVar30,auVar36._4_2_),CONCAT22(auVar35._0_2_ * sVar33,sVar48));
  auVar17._4_8_ = (long)((unkuint10)Var25 >> 0x10);
  auVar17._2_2_ = auVar36._2_2_;
  auVar17._0_2_ = auVar35._2_2_ * sVar38;
  iVar45 = CONCAT22(auVar36._0_2_,auVar35._0_2_ * sVar33);
  sVar48 = auVar40._0_2_;
  sVar42 = auVar40._2_2_;
  sVar51 = auVar39._2_2_ * sVar42;
  auVar35 = pmulhw(auVar68,auVar41);
  iVar47 = CONCAT22(auVar35._6_2_,sVar51);
  Var26 = CONCAT64(CONCAT42(iVar47,auVar35._4_2_),CONCAT22(auVar39._0_2_ * sVar48,sVar51));
  auVar18._4_8_ = (long)((unkuint10)Var26 >> 0x10);
  auVar18._2_2_ = auVar35._2_2_;
  auVar18._0_2_ = auVar39._2_2_ * sVar42;
  iVar43 = CONCAT22(auVar35._0_2_,auVar39._0_2_ * sVar48);
  iVar49 = (int)((unkuint10)Var25 >> 0x10);
  iVar46 = (int)((unkuint10)Var26 >> 0x10);
  if ((wd & 4U) == 0) {
    if (0 < ht) {
      iVar43 = iVar29 + iVar45 + iVar43;
      iVar45 = iVar29 + auVar17._0_4_ + auVar18._0_4_;
      iVar46 = iVar29 + iVar49 + iVar46;
      iVar47 = iVar29 + iVar30 + iVar47;
      lVar32 = (long)wd;
      iVar30 = 0;
      auVar35 = ZEXT416((uint)shift);
      do {
        if (0 < wd) {
          lVar31 = 0;
          do {
            auVar36 = *(undefined1 (*) [16])pi2_src1;
            auVar39 = *(undefined1 (*) [16])pi2_src2;
            auVar40 = *(undefined1 (*) [16])(*(undefined1 (*) [16])pi2_src1 + (long)src_strd1 * 2);
            auVar44 = *(undefined1 (*) [16])(*(undefined1 (*) [16])pi2_src2 + (long)src_strd2 * 2);
            sVar51 = auVar36._6_2_ * sVar38;
            sVar64 = auVar39._6_2_ * sVar42;
            sVar53 = auVar40._6_2_ * sVar38;
            sVar67 = auVar44._6_2_ * sVar42;
            auVar68 = pmulhw(auVar36,auVar37);
            auVar69 = pmulhw(auVar39,auVar41);
            auVar70 = pmulhw(auVar40,auVar37);
            auVar71 = pmulhw(auVar44,auVar41);
            iVar58 = CONCAT22(auVar68._8_2_,auVar36._8_2_ * sVar33);
            auVar59._0_8_ = CONCAT26(auVar68._10_2_,CONCAT24(auVar36._10_2_ * sVar38,iVar58));
            auVar59._8_2_ = auVar36._12_2_ * sVar33;
            auVar59._10_2_ = auVar68._12_2_;
            auVar60._12_2_ = auVar36._14_2_ * sVar38;
            auVar60._0_12_ = auVar59;
            auVar60._14_2_ = auVar68._14_2_;
            iVar72 = CONCAT22(auVar69._8_2_,auVar39._8_2_ * sVar48);
            auVar73._0_8_ = CONCAT26(auVar69._10_2_,CONCAT24(auVar39._10_2_ * sVar42,iVar72));
            auVar73._8_2_ = auVar39._12_2_ * sVar48;
            auVar73._10_2_ = auVar69._12_2_;
            auVar74._12_2_ = auVar39._14_2_ * sVar42;
            auVar74._0_12_ = auVar73;
            auVar74._14_2_ = auVar69._14_2_;
            iVar54 = CONCAT22(auVar70._8_2_,auVar40._8_2_ * sVar33);
            auVar55._0_8_ = CONCAT26(auVar70._10_2_,CONCAT24(auVar40._10_2_ * sVar38,iVar54));
            auVar55._8_2_ = auVar40._12_2_ * sVar33;
            auVar55._10_2_ = auVar70._12_2_;
            auVar56._12_2_ = auVar40._14_2_ * sVar38;
            auVar56._0_12_ = auVar55;
            auVar56._14_2_ = auVar70._14_2_;
            iVar75 = CONCAT22(auVar71._8_2_,auVar44._8_2_ * sVar48);
            auVar76._0_8_ = CONCAT26(auVar71._10_2_,CONCAT24(auVar44._10_2_ * sVar42,iVar75));
            auVar76._8_2_ = auVar44._12_2_ * sVar48;
            auVar76._10_2_ = auVar71._12_2_;
            auVar77._12_2_ = auVar44._14_2_ * sVar42;
            auVar77._0_12_ = auVar76;
            auVar77._14_2_ = auVar71._14_2_;
            iVar29 = CONCAT22(auVar68._6_2_,sVar51);
            Var25 = CONCAT64(CONCAT42(iVar29,auVar68._4_2_),CONCAT22(auVar36._4_2_ * sVar33,sVar51))
            ;
            auVar19._4_8_ = (long)((unkuint10)Var25 >> 0x10);
            auVar19._2_2_ = auVar68._2_2_;
            auVar19._0_2_ = auVar36._2_2_ * sVar38;
            iVar49 = CONCAT22(auVar69._6_2_,sVar64);
            Var26 = CONCAT64(CONCAT42(iVar49,auVar69._4_2_),CONCAT22(auVar39._4_2_ * sVar48,sVar64))
            ;
            auVar20._4_8_ = (long)((unkuint10)Var26 >> 0x10);
            auVar20._2_2_ = auVar69._2_2_;
            auVar20._0_2_ = auVar39._2_2_ * sVar42;
            iVar62 = CONCAT22(auVar70._6_2_,sVar53);
            Var27 = CONCAT64(CONCAT42(iVar62,auVar70._4_2_),CONCAT22(auVar40._4_2_ * sVar33,sVar53))
            ;
            auVar21._4_8_ = (long)((unkuint10)Var27 >> 0x10);
            auVar21._2_2_ = auVar70._2_2_;
            auVar21._0_2_ = auVar40._2_2_ * sVar38;
            iVar65 = CONCAT22(auVar71._6_2_,sVar67);
            Var28 = CONCAT64(CONCAT42(iVar65,auVar71._4_2_),CONCAT22(auVar44._4_2_ * sVar48,sVar67))
            ;
            auVar22._4_8_ = (long)((unkuint10)Var28 >> 0x10);
            auVar22._2_2_ = auVar71._2_2_;
            auVar22._0_2_ = auVar44._2_2_ * sVar42;
            auVar50._0_4_ =
                 CONCAT22(auVar68._0_2_,auVar36._0_2_ * sVar33) + iVar43 +
                 CONCAT22(auVar69._0_2_,auVar39._0_2_ * sVar48) >> auVar35;
            auVar50._4_4_ = auVar19._0_4_ + iVar45 + auVar20._0_4_ >> auVar35;
            auVar50._8_4_ =
                 (int)((unkuint10)Var25 >> 0x10) + iVar46 + (int)((unkuint10)Var26 >> 0x10) >>
                 auVar35;
            auVar50._12_4_ = iVar29 + iVar47 + iVar49 >> auVar35;
            auVar52._0_4_ =
                 CONCAT22(auVar70._0_2_,auVar40._0_2_ * sVar33) + iVar43 +
                 CONCAT22(auVar71._0_2_,auVar44._0_2_ * sVar48) >> auVar35;
            auVar52._4_4_ = auVar21._0_4_ + iVar45 + auVar22._0_4_ >> auVar35;
            auVar52._8_4_ =
                 (int)((unkuint10)Var27 >> 0x10) + iVar46 + (int)((unkuint10)Var28 >> 0x10) >>
                 auVar35;
            auVar52._12_4_ = iVar62 + iVar47 + iVar65 >> auVar35;
            auVar61._0_4_ = iVar58 + iVar43 + iVar72 >> auVar35;
            auVar61._4_4_ =
                 (int)((ulong)auVar59._0_8_ >> 0x20) + iVar45 + (int)((ulong)auVar73._0_8_ >> 0x20)
                 >> auVar35;
            auVar61._8_4_ = auVar59._8_4_ + iVar46 + auVar73._8_4_ >> auVar35;
            auVar61._12_4_ = auVar60._12_4_ + iVar47 + auVar74._12_4_ >> auVar35;
            auVar36 = packssdw(auVar50,auVar61);
            sVar51 = auVar36._0_2_;
            sVar64 = auVar36._2_2_;
            sVar5 = auVar36._4_2_;
            sVar7 = auVar36._6_2_;
            sVar9 = auVar36._8_2_;
            sVar11 = auVar36._10_2_;
            sVar13 = auVar36._12_2_;
            sVar15 = auVar36._14_2_;
            auVar57._0_4_ = iVar54 + iVar43 + iVar75 >> auVar35;
            auVar57._4_4_ =
                 (int)((ulong)auVar55._0_8_ >> 0x20) + iVar45 + (int)((ulong)auVar76._0_8_ >> 0x20)
                 >> auVar35;
            auVar57._8_4_ = auVar55._8_4_ + iVar46 + auVar76._8_4_ >> auVar35;
            auVar57._12_4_ = auVar56._12_4_ + iVar47 + auVar77._12_4_ >> auVar35;
            auVar39 = packssdw(auVar52,auVar57);
            sVar53 = auVar39._0_2_;
            sVar67 = auVar39._2_2_;
            sVar6 = auVar39._4_2_;
            sVar8 = auVar39._6_2_;
            sVar10 = auVar39._8_2_;
            sVar12 = auVar39._10_2_;
            sVar14 = auVar39._12_2_;
            sVar16 = auVar39._14_2_;
            *(ulong *)(pu1_dst + lVar31) =
                 CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar36[0xe] - (0xff < sVar15),
                          CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar36[0xc] - (0xff < sVar13),
                                   CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar36[10] -
                                            (0xff < sVar11),
                                            CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar36[8] -
                                                     (0xff < sVar9),
                                                     CONCAT13((0 < sVar7) * (sVar7 < 0x100) *
                                                              auVar36[6] - (0xff < sVar7),
                                                              CONCAT12((0 < sVar5) * (sVar5 < 0x100)
                                                                       * auVar36[4] - (0xff < sVar5)
                                                                       ,CONCAT11((0 < sVar64) *
                                                                                 (sVar64 < 0x100) *
                                                                                 auVar36[2] -
                                                                                 (0xff < sVar64),
                                                                                 (0 < sVar51) *
                                                                                 (sVar51 < 0x100) *
                                                                                 auVar36[0] -
                                                                                 (0xff < sVar51)))))
                                           )));
            *(ulong *)(pu1_dst + lVar31 + dst_strd) =
                 CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar39[0xe] - (0xff < sVar16),
                          CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar39[0xc] - (0xff < sVar14),
                                   CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar39[10] -
                                            (0xff < sVar12),
                                            CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar39[8] -
                                                     (0xff < sVar10),
                                                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                              auVar39[6] - (0xff < sVar8),
                                                              CONCAT12((0 < sVar6) * (sVar6 < 0x100)
                                                                       * auVar39[4] - (0xff < sVar6)
                                                                       ,CONCAT11((0 < sVar67) *
                                                                                 (sVar67 < 0x100) *
                                                                                 auVar39[2] -
                                                                                 (0xff < sVar67),
                                                                                 (0 < sVar53) *
                                                                                 (sVar53 < 0x100) *
                                                                                 auVar39[0] -
                                                                                 (0xff < sVar53)))))
                                           )));
            pi2_src1 = (WORD16 *)((long)pi2_src1 + 0x10);
            pi2_src2 = (WORD16 *)((long)pi2_src2 + 0x10);
            lVar31 = lVar31 + 8;
          } while ((int)lVar31 < wd);
          pu1_dst = pu1_dst + lVar31;
        }
        pi2_src1 = (WORD16 *)((long)pi2_src1 + (long)(src_strd1 * 2) * 2 + lVar32 * -2);
        pi2_src2 = (WORD16 *)((long)pi2_src2 + (long)(src_strd2 * 2) * 2 + lVar32 * -2);
        pu1_dst = pu1_dst + (dst_strd * 2 - lVar32);
        iVar30 = iVar30 + 2;
      } while (iVar30 < ht);
    }
  }
  else if (0 < ht) {
    iVar43 = iVar29 + iVar45 + iVar43;
    iVar45 = iVar29 + auVar17._0_4_ + auVar18._0_4_;
    iVar46 = iVar29 + iVar49 + iVar46;
    iVar47 = iVar29 + iVar30 + iVar47;
    lVar32 = (long)-wd;
    iVar30 = 0;
    auVar35 = ZEXT416((uint)shift);
    do {
      if (0 < wd) {
        lVar31 = 0;
        do {
          uVar1 = *(undefined8 *)(pi2_src1 + src_strd1);
          uVar2 = *(undefined8 *)pi2_src1;
          auVar39._8_8_ = uVar1;
          auVar39._0_8_ = uVar2;
          uVar3 = *(undefined8 *)(pi2_src2 + src_strd2);
          uVar4 = *(undefined8 *)pi2_src2;
          auVar40._8_8_ = uVar3;
          auVar40._0_8_ = uVar4;
          sVar51 = sVar38 * (short)((ulong)uVar2 >> 0x30);
          sVar53 = sVar42 * (short)((ulong)uVar4 >> 0x30);
          auVar36 = pmulhw(auVar39,auVar37);
          auVar39 = pmulhw(auVar40,auVar41);
          iVar62 = CONCAT22(auVar36._8_2_,sVar33 * (short)uVar1);
          auVar63._0_8_ =
               CONCAT26(auVar36._10_2_,CONCAT24(sVar38 * (short)((ulong)uVar1 >> 0x10),iVar62));
          auVar63._8_2_ = sVar33 * (short)((ulong)uVar1 >> 0x20);
          auVar63._10_2_ = auVar36._12_2_;
          auVar69._12_2_ = sVar38 * (short)((ulong)uVar1 >> 0x30);
          auVar69._0_12_ = auVar63;
          auVar69._14_2_ = auVar36._14_2_;
          iVar65 = CONCAT22(auVar39._8_2_,sVar48 * (short)uVar3);
          auVar66._0_8_ =
               CONCAT26(auVar39._10_2_,CONCAT24(sVar42 * (short)((ulong)uVar3 >> 0x10),iVar65));
          auVar66._8_2_ = sVar48 * (short)((ulong)uVar3 >> 0x20);
          auVar66._10_2_ = auVar39._12_2_;
          auVar71._12_2_ = sVar42 * (short)((ulong)uVar3 >> 0x30);
          auVar71._0_12_ = auVar66;
          auVar71._14_2_ = auVar39._14_2_;
          iVar29 = CONCAT22(auVar36._6_2_,sVar51);
          Var25 = CONCAT64(CONCAT42(iVar29,auVar36._4_2_),
                           CONCAT22(sVar33 * (short)((ulong)uVar2 >> 0x20),sVar51));
          auVar23._4_8_ = (long)((unkuint10)Var25 >> 0x10);
          auVar23._2_2_ = auVar36._2_2_;
          auVar23._0_2_ = sVar38 * (short)((ulong)uVar2 >> 0x10);
          iVar49 = CONCAT22(auVar39._6_2_,sVar53);
          Var26 = CONCAT64(CONCAT42(iVar49,auVar39._4_2_),
                           CONCAT22(sVar48 * (short)((ulong)uVar4 >> 0x20),sVar53));
          auVar24._4_8_ = (long)((unkuint10)Var26 >> 0x10);
          auVar24._2_2_ = auVar39._2_2_;
          auVar24._0_2_ = sVar42 * (short)((ulong)uVar4 >> 0x10);
          auVar36._0_4_ =
               CONCAT22(auVar36._0_2_,sVar33 * (short)uVar2) + iVar43 +
               CONCAT22(auVar39._0_2_,sVar48 * (short)uVar4) >> auVar35;
          auVar36._4_4_ = auVar23._0_4_ + iVar45 + auVar24._0_4_ >> auVar35;
          auVar36._8_4_ =
               (int)((unkuint10)Var25 >> 0x10) + iVar46 + (int)((unkuint10)Var26 >> 0x10) >> auVar35
          ;
          auVar36._12_4_ = iVar29 + iVar47 + iVar49 >> auVar35;
          auVar70._0_4_ = iVar62 + iVar43 + iVar65 >> auVar35;
          auVar70._4_4_ =
               (int)((ulong)auVar63._0_8_ >> 0x20) + iVar45 + (int)((ulong)auVar66._0_8_ >> 0x20) >>
               auVar35;
          auVar70._8_4_ = auVar63._8_4_ + iVar46 + auVar66._8_4_ >> auVar35;
          auVar70._12_4_ = auVar69._12_4_ + iVar47 + auVar71._12_4_ >> auVar35;
          auVar36 = packssdw(auVar36,auVar70);
          sVar51 = auVar36._0_2_;
          sVar53 = auVar36._2_2_;
          sVar64 = auVar36._4_2_;
          sVar67 = auVar36._6_2_;
          uVar34 = CONCAT13((0 < sVar67) * (sVar67 < 0x100) * auVar36[6] - (0xff < sVar67),
                            CONCAT12((0 < sVar64) * (sVar64 < 0x100) * auVar36[4] - (0xff < sVar64),
                                     CONCAT11((0 < sVar53) * (sVar53 < 0x100) * auVar36[2] -
                                              (0xff < sVar53),
                                              (0 < sVar51) * (sVar51 < 0x100) * auVar36[0] -
                                              (0xff < sVar51))));
          sVar51 = auVar36._8_2_;
          sVar53 = auVar36._10_2_;
          sVar64 = auVar36._12_2_;
          sVar67 = auVar36._14_2_;
          *(undefined4 *)(pu1_dst + lVar31) = uVar34;
          *(int *)(pu1_dst + lVar31 + dst_strd) =
               (int)(CONCAT17((0 < sVar67) * (sVar67 < 0x100) * auVar36[0xe] - (0xff < sVar67),
                              CONCAT16((0 < sVar64) * (sVar64 < 0x100) * auVar36[0xc] -
                                       (0xff < sVar64),
                                       CONCAT15((0 < sVar53) * (sVar53 < 0x100) * auVar36[10] -
                                                (0xff < sVar53),
                                                CONCAT14((0 < sVar51) * (sVar51 < 0x100) *
                                                         auVar36[8] - (0xff < sVar51),uVar34)))) >>
                    0x20);
          pi2_src1 = pi2_src1 + 4;
          pi2_src2 = pi2_src2 + 4;
          lVar31 = lVar31 + 4;
        } while ((int)lVar31 < wd);
        pu1_dst = pu1_dst + lVar31;
      }
      pi2_src1 = pi2_src1 + lVar32 + src_strd1 * 2;
      pi2_src2 = pi2_src2 + lVar32 + src_strd2 * 2;
      pu1_dst = pu1_dst + dst_strd * 2 + lVar32;
      iVar30 = iVar30 + 2;
    } while (iVar30 < ht);
  }
  return;
}

Assistant:

void ihevc_weighted_pred_bi_ssse3(WORD16 *pi2_src1,
                                  WORD16 *pi2_src2,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd1,
                                  WORD32 src_strd2,
                                  WORD32 dst_strd,
                                  WORD32 wgt0,
                                  WORD32 off0,
                                  WORD32 wgt1,
                                  WORD32 off1,
                                  WORD32 shift,
                                  WORD32 lvl_shift1,
                                  WORD32 lvl_shift2,
                                  WORD32 ht,
                                  WORD32 wd)
{
    WORD32 row, col, temp;

    __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
    __m128i const_temp_4x32b, lvl_shift1_4x32b, lvl_shift2_4x32b, wgt0_8x16b, wgt1_8x16b;
    __m128i res_temp1_4x32b, res_temp2_4x32b, res_temp3_4x32b, res_temp4_4x32b;

#include <assert.h>
    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

    temp = (off0 + off1 + 1) << (shift - 1);

    // seting values in register
    lvl_shift1_4x32b = _mm_set1_epi16(lvl_shift1);
    wgt0_8x16b = _mm_set1_epi16(wgt0);
    lvl_shift2_4x32b = _mm_set1_epi16(lvl_shift2);
    wgt1_8x16b = _mm_set1_epi16(wgt1);

    /* lvl_shift1 * wgt0 */
    res_temp1_4x32b = _mm_mullo_epi16(lvl_shift1_4x32b, wgt0_8x16b);
    res_temp2_4x32b = _mm_mulhi_epi16(lvl_shift1_4x32b, wgt0_8x16b);
    /* lvl_shift2 * wgt1 */
    res_temp3_4x32b = _mm_mullo_epi16(lvl_shift2_4x32b, wgt1_8x16b);
    res_temp4_4x32b = _mm_mulhi_epi16(lvl_shift2_4x32b, wgt1_8x16b);

    const_temp_4x32b = _mm_set1_epi32(temp);

    /* lvl_shift1 * wgt0 */
    lvl_shift1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, res_temp2_4x32b);
    /* lvl_shift2 * wgt1 */
    lvl_shift2_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, res_temp4_4x32b);

    if(0 == (wd & 7)) /* wd multiple of 8 case */
    {
        __m128i res_temp5_4x32b, res_temp6_4x32b, res_temp7_4x32b, res_temp8_4x32b;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 2)
        {
            for(col = 0; col < wd; col += 8)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1)); /* row = 0 */
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2)); /* row = 0 */
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 1 * src_strd1)); /* row = 1 */
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 1 * src_strd2)); /* row = 1 */

                /*i4_tmp = (pi2_src[col]) * wgt*/ /* Lower 16 bit */
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt1_8x16b);
                res_temp3_4x32b  = _mm_mullo_epi16(src_temp3_8x16b, wgt0_8x16b);
                res_temp4_4x32b  = _mm_mullo_epi16(src_temp4_8x16b, wgt1_8x16b);
                /*i4_tmp = (pi2_src[col] ) * wgt*/ /* Higher 16 bit */
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt1_8x16b);
                src_temp3_8x16b  = _mm_mulhi_epi16(src_temp3_8x16b, wgt0_8x16b);
                src_temp4_8x16b  = _mm_mulhi_epi16(src_temp4_8x16b, wgt1_8x16b);

                /* Get 32 bit Result */
                res_temp5_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp6_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp7_4x32b = _mm_unpackhi_epi16(res_temp3_4x32b, src_temp3_8x16b);
                res_temp8_4x32b = _mm_unpackhi_epi16(res_temp4_4x32b, src_temp4_8x16b);

                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp3_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, src_temp3_8x16b);
                res_temp4_4x32b = _mm_unpacklo_epi16(res_temp4_4x32b, src_temp4_8x16b);

                /* (pi2_src[col] + lvl_shift) * wgt */
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, lvl_shift1_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, lvl_shift2_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, lvl_shift1_4x32b);
                res_temp8_4x32b = _mm_add_epi32(res_temp8_4x32b, lvl_shift2_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift1_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift1_4x32b);
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift2_4x32b);

                /* (pi2_src1[col] + lvl_shift1) * wgt0 + (pi2_src2[col] + lvl_shift2) * wgt1 */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, res_temp4_4x32b);
                /* i4_tmp += (off0 + off1 + 1) << (shift - 1); */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, const_temp_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, const_temp_4x32b);
                /* (i4_tmp >> shift) */
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b,  shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b,  shift);

                /* Next 4 Pixels */
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, res_temp6_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, res_temp8_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, const_temp_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, const_temp_4x32b);
                res_temp5_4x32b = _mm_srai_epi32(res_temp5_4x32b,  shift);
                res_temp7_4x32b = _mm_srai_epi32(res_temp7_4x32b,  shift);

                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp5_4x32b);
                res_temp3_4x32b = _mm_packs_epi32(res_temp3_4x32b, res_temp7_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);
                res_temp3_4x32b = _mm_packus_epi16(res_temp3_4x32b, res_temp3_4x32b);

                /* store four 8-bit output values  */
                _mm_storel_epi64((__m128i *)(pu1_dst + 0 * dst_strd), res_temp1_4x32b); /* row = 0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), res_temp3_4x32b); /* row = 1*/

                pi2_src1 += 8;  /* Pointer update */
                pi2_src2 += 8;  /* Pointer update */
                pu1_dst  += 8;  /* Pointer update */

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src1 = pi2_src1 - wd + 2 * src_strd1;  /* Pointer update */
            pi2_src2 = pi2_src2 - wd + 2 * src_strd2;  /* Pointer update */
            pu1_dst  = pu1_dst  - wd + 2 * dst_strd;   /* Pointer update */

        } /* outer loop ends */
    }
    else /* wd multiple of 4 case */
    {
        WORD32 dst0, dst1;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 2)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1)); /* row = 0 */
                src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2)); /* row = 0 */
                src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + 1 * src_strd1)); /* row = 1 */
                src_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + 1 * src_strd2)); /* row = 1 */

                /* 2 rows together */
                src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);
                src_temp2_8x16b = _mm_unpacklo_epi64(src_temp2_8x16b, src_temp4_8x16b);

                /*i4_tmp = (pi2_src[col]) * wgt*/ /* Lower 16 bit */
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt1_8x16b);
                /*i4_tmp = (pi2_src[col] ) * wgt*/ /* Higher 16 bit */
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt1_8x16b);

                /* Get 32 bit Result */
                res_temp3_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp4_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);

                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);

                /* (pi2_src[col] + lvl_shift) * wgt */
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift1_4x32b);
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift2_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift1_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift2_4x32b);

                /* (pi2_src1[col] + lvl_shift1) * wgt0 + (pi2_src2[col] + lvl_shift2) * wgt1 */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, res_temp4_4x32b);

                /* i4_tmp += (off0 + off1 + 1) << (shift - 1); */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, const_temp_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, const_temp_4x32b);

                /* (i4_tmp >> shift) */
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b,  shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b,  shift);

                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp3_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);

                dst0 = _mm_cvtsi128_si32(res_temp1_4x32b);

                /* dst row = 1 to 3 */
                res_temp2_4x32b = _mm_shuffle_epi32(res_temp1_4x32b, 1);

                /* store four 8-bit output values  */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                dst1 = _mm_cvtsi128_si32(res_temp2_4x32b);

                /* row = 1 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;

                pi2_src1 += 4;  /* Pointer update */
                pi2_src2 += 4;  /* Pointer update */
                pu1_dst  += 4;  /* Pointer update */

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src1 = pi2_src1 - wd + 2 * src_strd1;  /* Pointer update */
            pi2_src2 = pi2_src2 - wd + 2 * src_strd2;  /* Pointer update */
            pu1_dst  = pu1_dst  - wd + 2 * dst_strd;   /* Pointer update */

        } /* outer loop ends */
    }

}